

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_symbol.cpp
# Opt level: O0

int DSDcc::DSDSymbol::compShort(void *a,void *b)

{
  void *b_local;
  void *a_local;
  undefined4 local_4;
  
  if (*a == *b) {
    local_4 = 0;
  }
  else if (*a < *b) {
    local_4 = -1;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int DSDSymbol::compShort(const void *a, const void *b)
{
    if (*((const short *) a) == *((const short *) b))
        return 0;
    else if (*((const short *) a) < *((const short *) b))
        return -1;
    else
        return 1;
}